

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *max,int param_2,bool param_3)

{
  uint *puVar1;
  undefined8 *puVar2;
  Real a;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar14;
  long lVar15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar16;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  long lVar17;
  uint uVar18;
  long lVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  long lVar21;
  long lVar22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *max_00;
  long in_FS_OFFSET;
  type t;
  SPxId enterId;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_2bc;
  cpp_dec_float<100U,_int,_void> local_2b8;
  uint local_25c;
  cpp_dec_float<100U,_int,_void> local_258;
  long local_200;
  cpp_dec_float<100U,_int,_void> local_1f8;
  SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1a0;
  cpp_dec_float<100U,_int,_void> local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  cpp_dec_float<100U,_int,_void> *local_138;
  DataKey local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  cpp_dec_float<100U,_int,_void> local_a8;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])
                     (this,max,CONCAT44(in_register_00000014,param_2),
                      CONCAT71(in_register_00000009,param_3));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar12) + 0xc38) + 0x68));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_00,iVar12) + 0xc40) + 0x68));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_d8 = **(long **)(CONCAT44(extraout_var_01,iVar12) + 0xc40);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar17 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar12) + 0xc40) + 0x88);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar14 = *(long *)(CONCAT44(extraout_var_03,iVar12) + 0xc40);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_d0 = **(long **)(CONCAT44(extraout_var_04,iVar12) + 0xc60);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_b8 = **(long **)(CONCAT44(extraout_var_05,iVar12) + 0xc58);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c8 = **(long **)(CONCAT44(extraout_var_06,iVar12) + 0xc38);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar15 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar12) + 0xc38) + 0x88);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_200 = *(long *)(CONCAT44(extraout_var_08,iVar12) + 0xc38);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c0 = **(long **)(CONCAT44(extraout_var_09,iVar12) + 0xc70);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_b0 = **(long **)(CONCAT44(extraout_var_10,iVar12) + 0xc68);
  local_1a0 = this;
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_11,iVar12) + 0x1f8));
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems._56_5_ = 0;
  local_a8.data._M_elems[0xf]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_a8,a);
  local_1f8.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_1f8.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_1f8.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_1f8.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_1f8.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_1f8.data._M_elems._40_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 10);
  local_1f8.data._M_elems._48_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xc);
  local_1f8.data._M_elems._56_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xe);
  local_1f8.exp = (max->m_backend).exp;
  local_1f8.neg = (max->m_backend).neg;
  local_1f8.fpclass = (max->m_backend).fpclass;
  local_1f8.prec_elem = (max->m_backend).prec_elem;
  local_130.info = 0;
  local_130.idx = -1;
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  local_140 = max;
  if (local_1f8.fpclass == cpp_dec_float_NaN) {
LAB_004783ca:
    local_25c = 0xffffffff;
    local_2bc = 0xffffffff;
    if (0 < *(int *)(lVar14 + 0x70)) {
      local_58 = *(double *)(in_FS_OFFSET + -8);
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_138 = &(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_2bc = 0xffffffff;
      lVar19 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar14 + 0x78) + lVar19 * 4);
        lVar21 = (long)iVar12 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar21);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar21) + 2);
        puVar1 = (uint *)(lVar17 + 0x10 + lVar21);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x20 + lVar21);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x30 + lVar21);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar17 + 0x40 + lVar21);
        local_128.neg = *(bool *)(lVar17 + 0x44 + lVar21);
        local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar21);
        if (((local_128.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_128,&local_a8), iVar13 < 1)) {
          uVar3._0_4_ = local_a8.data._M_elems[0];
          uVar3._4_4_ = local_a8.data._M_elems[1];
          local_2b8.data._M_elems[0] = local_a8.data._M_elems[0];
          local_2b8.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar9._0_4_ = local_a8.data._M_elems[2];
          uVar9._4_4_ = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[2] = local_a8.data._M_elems[2];
          local_2b8.data._M_elems[3] = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
          local_2b8.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
          local_2b8.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
          local_2b8.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
          local_2b8.data._M_elems[8] = local_a8.data._M_elems[8];
          local_2b8.data._M_elems[9] = local_a8.data._M_elems[9];
          local_2b8.data._M_elems[10] = local_a8.data._M_elems[10];
          local_2b8.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
          local_2b8.data._M_elems[4] = local_a8.data._M_elems[4];
          local_2b8.data._M_elems[5] = local_a8.data._M_elems[5];
          local_2b8.data._M_elems[6] = local_a8.data._M_elems[6];
          local_2b8.data._M_elems[7] = local_a8.data._M_elems[7];
          local_2b8.exp = local_a8.exp;
          local_2b8.neg = local_a8.neg;
          local_2b8.fpclass = local_a8.fpclass;
          local_2b8.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_2b8.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar8 = uVar3;
          uVar10 = uVar9;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar8 = local_2b8.data._M_elems._0_8_, uVar10 = local_2b8.data._M_elems._8_8_,
              local_128.fpclass != cpp_dec_float_NaN)) &&
             (local_2b8.data._M_elems._0_8_ = uVar3, local_2b8.data._M_elems._8_8_ = uVar9,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_128,&local_2b8), uVar8 = local_2b8.data._M_elems._0_8_,
             uVar10 = local_2b8.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b8 + lVar21);
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_2b8,local_58);
            uVar8 = local_2b8.data._M_elems._0_8_;
            uVar10 = local_2b8.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(pcVar20,&local_2b8), uVar8 = local_2b8.data._M_elems._0_8_,
                     uVar10 = local_2b8.data._M_elems._8_8_, iVar13 < 0)) {
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 0x10;
              local_258.data._M_elems[0] = 0;
              local_258.data._M_elems[1] = 0;
              local_258.data._M_elems[2] = 0;
              local_258.data._M_elems[3] = 0;
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems[6] = 0;
              local_258.data._M_elems[7] = 0;
              local_258.data._M_elems[8] = 0;
              local_258.data._M_elems[9] = 0;
              local_258.data._M_elems[10] = 0;
              local_258.data._M_elems[0xb] = 0;
              local_258.data._M_elems[0xc] = 0;
              local_258.data._M_elems[0xd] = 0;
              local_258.data._M_elems._56_5_ = 0;
              local_258.data._M_elems[0xf]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,pcVar20);
                if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                  local_258.neg = (bool)(local_258.neg ^ 1);
                }
              }
              else {
                if (&local_258 != pcVar20) {
                  local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                  local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_258.exp = pcVar20->exp;
                  local_258.neg = pcVar20->neg;
                  local_258.fpclass = pcVar20->fpclass;
                  local_258.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
              }
              local_198.fpclass = cpp_dec_float_finite;
              local_198.prec_elem = 0x10;
              local_198.data._M_elems[0] = 0;
              local_198.data._M_elems[1] = 0;
              local_198.data._M_elems[2] = 0;
              local_198.data._M_elems[3] = 0;
              local_198.data._M_elems[4] = 0;
              local_198.data._M_elems[5] = 0;
              local_198.data._M_elems[6] = 0;
              local_198.data._M_elems[7] = 0;
              local_198.data._M_elems[8] = 0;
              local_198.data._M_elems[9] = 0;
              local_198.data._M_elems[10] = 0;
              local_198.data._M_elems[0xb] = 0;
              local_198.data._M_elems[0xc] = 0;
              local_198.data._M_elems[0xd] = 0;
              local_198.data._M_elems._56_5_ = 0;
              local_198.data._M_elems[0xf]._1_3_ = 0;
              local_198.exp = 0;
              local_198.neg = false;
              pcVar20 = &local_258;
              if (&local_198 != local_138) {
                local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
                local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
                local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
                local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
                local_198.data._M_elems[8] = local_258.data._M_elems[8];
                local_198.data._M_elems[9] = local_258.data._M_elems[9];
                local_198.data._M_elems[10] = local_258.data._M_elems[10];
                local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
                local_198.data._M_elems[4] = local_258.data._M_elems[4];
                local_198.data._M_elems[5] = local_258.data._M_elems[5];
                local_198.data._M_elems[6] = local_258.data._M_elems[6];
                local_198.data._M_elems[7] = local_258.data._M_elems[7];
                local_198.data._M_elems[0] = local_258.data._M_elems[0];
                local_198.data._M_elems[1] = local_258.data._M_elems[1];
                local_198.data._M_elems[2] = local_258.data._M_elems[2];
                local_198.data._M_elems[3] = local_258.data._M_elems[3];
                local_198.exp = local_258.exp;
                local_198.neg = local_258.neg;
                local_198.fpclass = local_258.fpclass;
                local_198.prec_elem = local_258.prec_elem;
                pcVar20 = local_138;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_198,pcVar20);
              goto LAB_004789f8;
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_d0 + lVar21);
          local_2b8.fpclass = cpp_dec_float_finite;
          local_2b8.prec_elem = 0x10;
          local_2b8.data._M_elems[0] = 0;
          local_2b8.data._M_elems[1] = 0;
          local_2b8.data._M_elems[2] = 0;
          local_2b8.data._M_elems[3] = 0;
          local_2b8.data._M_elems[4] = 0;
          local_2b8.data._M_elems[5] = 0;
          local_2b8.data._M_elems[6] = 0;
          local_2b8.data._M_elems[7] = 0;
          local_2b8.data._M_elems[8] = 0;
          local_2b8.data._M_elems[9] = 0;
          local_2b8.data._M_elems[10] = 0;
          local_2b8.data._M_elems[0xb] = 0;
          local_2b8.data._M_elems[0xc] = 0;
          local_2b8.data._M_elems[0xd] = 0;
          local_2b8.data._M_elems._56_5_ = 0;
          local_2b8.data._M_elems[0xf]._1_3_ = 0;
          local_2b8.exp = 0;
          local_2b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_2b8,local_48);
          uVar8 = local_2b8.data._M_elems._0_8_;
          uVar10 = local_2b8.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_2b8), uVar8 = local_2b8.data._M_elems._0_8_,
                uVar10 = local_2b8.data._M_elems._8_8_, 0 < iVar13)) {
            local_258.fpclass = cpp_dec_float_finite;
            local_258.prec_elem = 0x10;
            local_258.data._M_elems[0] = 0;
            local_258.data._M_elems[1] = 0;
            local_258.data._M_elems[2] = 0;
            local_258.data._M_elems[3] = 0;
            local_258.data._M_elems[4] = 0;
            local_258.data._M_elems[5] = 0;
            local_258.data._M_elems[6] = 0;
            local_258.data._M_elems[7] = 0;
            local_258.data._M_elems[8] = 0;
            local_258.data._M_elems[9] = 0;
            local_258.data._M_elems[10] = 0;
            local_258.data._M_elems[0xb] = 0;
            local_258.data._M_elems[0xc] = 0;
            local_258.data._M_elems[0xd] = 0;
            local_258.data._M_elems._56_5_ = 0;
            local_258.data._M_elems[0xf]._1_3_ = 0;
            local_258.exp = 0;
            local_258.neg = false;
            if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,pcVar20);
              if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                local_258.neg = (bool)(local_258.neg ^ 1);
              }
            }
            else {
              if (&local_258 != pcVar20) {
                local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_258.exp = pcVar20->exp;
                local_258.neg = pcVar20->neg;
                local_258.fpclass = pcVar20->fpclass;
                local_258.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
            }
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            if (&local_198 == local_138) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,&local_258);
              if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                local_198.neg = (bool)(local_198.neg ^ 1);
              }
            }
            else {
              local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_258.data._M_elems[8];
              local_198.data._M_elems[9] = local_258.data._M_elems[9];
              local_198.data._M_elems[10] = local_258.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_258.data._M_elems[4];
              local_198.data._M_elems[5] = local_258.data._M_elems[5];
              local_198.data._M_elems[6] = local_258.data._M_elems[6];
              local_198.data._M_elems[7] = local_258.data._M_elems[7];
              local_198.data._M_elems[0] = local_258.data._M_elems[0];
              local_198.data._M_elems[1] = local_258.data._M_elems[1];
              local_198.data._M_elems[2] = local_258.data._M_elems[2];
              local_198.data._M_elems[3] = local_258.data._M_elems[3];
              local_198.exp = local_258.exp;
              local_198.neg = local_258.neg;
              local_198.fpclass = local_258.fpclass;
              local_198.prec_elem = local_258.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,local_138);
            }
LAB_004789f8:
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_2b8,&local_198,&local_128);
            uVar8 = local_2b8.data._M_elems._0_8_;
            uVar10 = local_2b8.data._M_elems._8_8_;
            if (((local_2b8.fpclass != cpp_dec_float_NaN) &&
                (local_1f8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_2b8,&local_1f8), uVar8 = local_2b8.data._M_elems._0_8_,
               uVar10 = local_2b8.data._M_elems._8_8_, 0 < iVar13)) {
              iVar13 = (*(local_1a0->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_130 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_13,iVar13),iVar12);
              local_1f8.data._M_elems[4] = local_2b8.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_2b8.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_2b8.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_2b8.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_2b8.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_2b8.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_2b8.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf]._1_3_ = local_2b8.data._M_elems[0xf]._1_3_;
              local_1f8.data._M_elems._56_5_ = local_2b8.data._M_elems._56_5_;
              local_1f8.data._M_elems[0] = local_2b8.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_2b8.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_2b8.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_2b8.data._M_elems[3];
              local_1f8.exp = local_2b8.exp;
              local_1f8.neg = local_2b8.neg;
              local_1f8.fpclass = local_2b8.fpclass;
              local_1f8.prec_elem = local_2b8.prec_elem;
              local_2bc = (uint)lVar19;
              uVar8 = local_2b8.data._M_elems._0_8_;
              uVar10 = local_2b8.data._M_elems._8_8_;
            }
          }
        }
        local_2b8.data._M_elems._8_8_ = uVar10;
        local_2b8.data._M_elems._0_8_ = uVar8;
        lVar19 = lVar19 + 1;
      } while (lVar19 < *(int *)(lVar14 + 0x70));
    }
    lVar19 = local_200;
    if (0 < *(int *)(local_200 + 0x70)) {
      local_58 = *(double *)(in_FS_OFFSET + -8);
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_138 = &(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_25c = 0xffffffff;
      lVar21 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar19 + 0x78) + lVar21 * 4);
        lVar22 = (long)iVar12 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar22);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar22) + 2);
        puVar1 = (uint *)(lVar15 + 0x10 + lVar22);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar15 + 0x20 + lVar22);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar15 + 0x30 + lVar22);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar15 + 0x40 + lVar22);
        local_128.neg = *(bool *)(lVar15 + 0x44 + lVar22);
        local_128._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar22);
        if (((local_128.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_128,&local_a8), iVar13 < 1)) {
          uVar8._0_4_ = local_a8.data._M_elems[0];
          uVar8._4_4_ = local_a8.data._M_elems[1];
          local_2b8.data._M_elems[0] = local_a8.data._M_elems[0];
          local_2b8.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar10._0_4_ = local_a8.data._M_elems[2];
          uVar10._4_4_ = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[2] = local_a8.data._M_elems[2];
          local_2b8.data._M_elems[3] = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
          local_2b8.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
          local_2b8.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
          local_2b8.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
          local_2b8.data._M_elems[8] = local_a8.data._M_elems[8];
          local_2b8.data._M_elems[9] = local_a8.data._M_elems[9];
          local_2b8.data._M_elems[10] = local_a8.data._M_elems[10];
          local_2b8.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
          local_2b8.data._M_elems[4] = local_a8.data._M_elems[4];
          local_2b8.data._M_elems[5] = local_a8.data._M_elems[5];
          local_2b8.data._M_elems[6] = local_a8.data._M_elems[6];
          local_2b8.data._M_elems[7] = local_a8.data._M_elems[7];
          local_2b8.exp = local_a8.exp;
          local_2b8.neg = local_a8.neg;
          local_2b8.fpclass = local_a8.fpclass;
          local_2b8.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_2b8.neg = (bool)(local_a8.neg ^ 1);
          }
          lVar19 = local_200;
          uVar3 = uVar8;
          uVar9 = uVar10;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
              local_128.fpclass != cpp_dec_float_NaN)) &&
             (local_2b8.data._M_elems._0_8_ = uVar8, local_2b8.data._M_elems._8_8_ = uVar10,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_128,&local_2b8), lVar19 = local_200,
             uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
             iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b0 + lVar22);
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_2b8,local_58);
            lVar19 = local_200;
            uVar3 = local_2b8.data._M_elems._0_8_;
            uVar9 = local_2b8.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(pcVar20,&local_2b8), lVar19 = local_200,
                     uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
                     iVar13 < 0)) {
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 0x10;
              local_258.data._M_elems[0] = 0;
              local_258.data._M_elems[1] = 0;
              local_258.data._M_elems[2] = 0;
              local_258.data._M_elems[3] = 0;
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems[6] = 0;
              local_258.data._M_elems[7] = 0;
              local_258.data._M_elems[8] = 0;
              local_258.data._M_elems[9] = 0;
              local_258.data._M_elems[10] = 0;
              local_258.data._M_elems[0xb] = 0;
              local_258.data._M_elems[0xc] = 0;
              local_258.data._M_elems[0xd] = 0;
              local_258.data._M_elems._56_5_ = 0;
              local_258.data._M_elems[0xf]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8)) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,pcVar20);
                if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                  local_258.neg = (bool)(local_258.neg ^ 1);
                }
              }
              else {
                if (&local_258 != pcVar20) {
                  local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                  local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_258.exp = pcVar20->exp;
                  local_258.neg = pcVar20->neg;
                  local_258.fpclass = pcVar20->fpclass;
                  local_258.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8));
              }
              lVar19 = local_200;
              local_198.fpclass = cpp_dec_float_finite;
              local_198.prec_elem = 0x10;
              local_198.data._M_elems[0] = 0;
              local_198.data._M_elems[1] = 0;
              local_198.data._M_elems[2] = 0;
              local_198.data._M_elems[3] = 0;
              local_198.data._M_elems[4] = 0;
              local_198.data._M_elems[5] = 0;
              local_198.data._M_elems[6] = 0;
              local_198.data._M_elems[7] = 0;
              local_198.data._M_elems[8] = 0;
              local_198.data._M_elems[9] = 0;
              local_198.data._M_elems[10] = 0;
              local_198.data._M_elems[0xb] = 0;
              local_198.data._M_elems[0xc] = 0;
              local_198.data._M_elems[0xd] = 0;
              local_198.data._M_elems._56_5_ = 0;
              local_198.data._M_elems[0xf]._1_3_ = 0;
              local_198.exp = 0;
              local_198.neg = false;
              pcVar20 = &local_258;
              if (&local_198 != local_138) {
                local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
                local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
                local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
                local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
                local_198.data._M_elems[8] = local_258.data._M_elems[8];
                local_198.data._M_elems[9] = local_258.data._M_elems[9];
                local_198.data._M_elems[10] = local_258.data._M_elems[10];
                local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
                local_198.data._M_elems[4] = local_258.data._M_elems[4];
                local_198.data._M_elems[5] = local_258.data._M_elems[5];
                local_198.data._M_elems[6] = local_258.data._M_elems[6];
                local_198.data._M_elems[7] = local_258.data._M_elems[7];
                local_198.data._M_elems[0] = local_258.data._M_elems[0];
                local_198.data._M_elems[1] = local_258.data._M_elems[1];
                local_198.data._M_elems[2] = local_258.data._M_elems[2];
                local_198.data._M_elems[3] = local_258.data._M_elems[3];
                local_198.exp = local_258.exp;
                local_198.neg = local_258.neg;
                local_198.fpclass = local_258.fpclass;
                local_198.prec_elem = local_258.prec_elem;
                pcVar20 = local_138;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_198,pcVar20);
              local_2b8.fpclass = cpp_dec_float_finite;
              local_2b8.prec_elem = 0x10;
              local_2b8.data._M_elems[0] = 0;
              local_2b8.data._M_elems[1] = 0;
              local_2b8.data._M_elems[2] = 0;
              local_2b8.data._M_elems[3] = 0;
              local_2b8.data._M_elems[4] = 0;
              local_2b8.data._M_elems[5] = 0;
              local_2b8.data._M_elems[6] = 0;
              local_2b8.data._M_elems[7] = 0;
              local_2b8.data._M_elems[8] = 0;
              local_2b8.data._M_elems[9] = 0;
              local_2b8.data._M_elems[10] = 0;
              local_2b8.data._M_elems[0xb] = 0;
              local_2b8.data._M_elems[0xc] = 0;
              local_2b8.data._M_elems[0xd] = 0;
              local_2b8.data._M_elems._56_5_ = 0;
              local_2b8.data._M_elems[0xf]._1_3_ = 0;
              local_2b8.exp = 0;
              local_2b8.neg = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&local_2b8,&local_198,&local_128);
              uVar3 = local_2b8.data._M_elems._0_8_;
              uVar9 = local_2b8.data._M_elems._8_8_;
              if ((local_2b8.fpclass != cpp_dec_float_NaN) &&
                 (local_1f8.fpclass != cpp_dec_float_NaN)) {
                iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_2b8,&local_1f8);
                goto joined_r0x0047927c;
              }
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_c0 + lVar22);
          local_2b8.fpclass = cpp_dec_float_finite;
          local_2b8.prec_elem = 0x10;
          local_2b8.data._M_elems[0] = 0;
          local_2b8.data._M_elems[1] = 0;
          local_2b8.data._M_elems[2] = 0;
          local_2b8.data._M_elems[3] = 0;
          local_2b8.data._M_elems[4] = 0;
          local_2b8.data._M_elems[5] = 0;
          local_2b8.data._M_elems[6] = 0;
          local_2b8.data._M_elems[7] = 0;
          local_2b8.data._M_elems[8] = 0;
          local_2b8.data._M_elems[9] = 0;
          local_2b8.data._M_elems[10] = 0;
          local_2b8.data._M_elems[0xb] = 0;
          local_2b8.data._M_elems[0xc] = 0;
          local_2b8.data._M_elems[0xd] = 0;
          local_2b8.data._M_elems._56_5_ = 0;
          local_2b8.data._M_elems[0xf]._1_3_ = 0;
          local_2b8.exp = 0;
          local_2b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_2b8,local_48);
          lVar19 = local_200;
          uVar3 = local_2b8.data._M_elems._0_8_;
          uVar9 = local_2b8.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_2b8), lVar19 = local_200,
                uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
                0 < iVar13)) {
            local_258.fpclass = cpp_dec_float_finite;
            local_258.prec_elem = 0x10;
            local_258.data._M_elems[0] = 0;
            local_258.data._M_elems[1] = 0;
            local_258.data._M_elems[2] = 0;
            local_258.data._M_elems[3] = 0;
            local_258.data._M_elems[4] = 0;
            local_258.data._M_elems[5] = 0;
            local_258.data._M_elems[6] = 0;
            local_258.data._M_elems[7] = 0;
            local_258.data._M_elems[8] = 0;
            local_258.data._M_elems[9] = 0;
            local_258.data._M_elems[10] = 0;
            local_258.data._M_elems[0xb] = 0;
            local_258.data._M_elems[0xc] = 0;
            local_258.data._M_elems[0xd] = 0;
            local_258.data._M_elems._56_5_ = 0;
            local_258.data._M_elems[0xf]._1_3_ = 0;
            local_258.exp = 0;
            local_258.neg = false;
            if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,pcVar20);
              if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                local_258.neg = (bool)(local_258.neg ^ 1);
              }
            }
            else {
              if (&local_258 != pcVar20) {
                local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_258.exp = pcVar20->exp;
                local_258.neg = pcVar20->neg;
                local_258.fpclass = pcVar20->fpclass;
                local_258.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8));
            }
            lVar19 = local_200;
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            if (&local_198 == local_138) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,&local_258);
              if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                local_198.neg = (bool)(local_198.neg ^ 1);
              }
            }
            else {
              local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_258.data._M_elems[8];
              local_198.data._M_elems[9] = local_258.data._M_elems[9];
              local_198.data._M_elems[10] = local_258.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_258.data._M_elems[4];
              local_198.data._M_elems[5] = local_258.data._M_elems[5];
              local_198.data._M_elems[6] = local_258.data._M_elems[6];
              local_198.data._M_elems[7] = local_258.data._M_elems[7];
              local_198.data._M_elems[0] = local_258.data._M_elems[0];
              local_198.data._M_elems[1] = local_258.data._M_elems[1];
              local_198.data._M_elems[2] = local_258.data._M_elems[2];
              local_198.data._M_elems[3] = local_258.data._M_elems[3];
              local_198.exp = local_258.exp;
              local_198.neg = local_258.neg;
              local_198.fpclass = local_258.fpclass;
              local_198.prec_elem = local_258.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,local_138);
            }
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_2b8,&local_198,&local_128);
            uVar3 = local_2b8.data._M_elems._0_8_;
            uVar9 = local_2b8.data._M_elems._8_8_;
            if ((local_2b8.fpclass != cpp_dec_float_NaN) && (local_1f8.fpclass != cpp_dec_float_NaN)
               ) {
              iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_2b8,&local_1f8);
joined_r0x0047927c:
              uVar3 = local_2b8.data._M_elems._0_8_;
              uVar9 = local_2b8.data._M_elems._8_8_;
              if (0 < iVar13) {
                iVar13 = (*(local_1a0->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                local_130 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(extraout_var_14,iVar13),iVar12);
                local_1f8.data._M_elems[4] = local_2b8.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_2b8.data._M_elems[5];
                local_1f8.data._M_elems[6] = local_2b8.data._M_elems[6];
                local_1f8.data._M_elems[7] = local_2b8.data._M_elems[7];
                local_1f8.data._M_elems[8] = local_2b8.data._M_elems[8];
                local_1f8.data._M_elems[9] = local_2b8.data._M_elems[9];
                local_1f8.data._M_elems[10] = local_2b8.data._M_elems[10];
                local_1f8.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
                local_1f8.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
                local_1f8.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
                local_1f8.data._M_elems[0xf]._1_3_ = local_2b8.data._M_elems[0xf]._1_3_;
                local_1f8.data._M_elems._56_5_ = local_2b8.data._M_elems._56_5_;
                local_1f8.data._M_elems[0] = local_2b8.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_2b8.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_2b8.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_2b8.data._M_elems[3];
                local_1f8.exp = local_2b8.exp;
                local_1f8.neg = local_2b8.neg;
                local_1f8.fpclass = local_2b8.fpclass;
                local_1f8.prec_elem = local_2b8.prec_elem;
                local_25c = (uint)lVar21;
                uVar3 = local_2b8.data._M_elems._0_8_;
                uVar9 = local_2b8.data._M_elems._8_8_;
              }
            }
          }
        }
        local_2b8.data._M_elems._8_8_ = uVar9;
        local_2b8.data._M_elems._0_8_ = uVar3;
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)(lVar19 + 0x70));
    }
    lVar22 = local_c0;
    lVar21 = local_d8;
    max_00 = local_140;
    uVar18 = local_25c;
    if ((int)local_25c < 0) {
      if ((int)local_2bc < 0) goto LAB_00479fc9;
      lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x78) + (ulong)local_2bc * 4);
      lVar15 = lVar14 * 0x50;
      local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar15);
      local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar15) + 2);
      puVar1 = (uint *)(lVar17 + 0x10 + lVar15);
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar17 + 0x20 + lVar15);
      local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar17 + 0x30 + lVar15);
      local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_128.exp = *(int *)(lVar17 + 0x40 + lVar15);
      local_128.neg = *(bool *)(lVar17 + 0x44 + lVar15);
      local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar15);
      lVar17 = local_d0;
      if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_128,&local_a8), lVar17 = local_d0, iVar12 < 0)) {
        lVar17 = local_b8;
      }
      goto LAB_00479e27;
    }
    lVar17 = (long)*(int *)(*(long *)(lVar19 + 0x78) + (ulong)local_25c * 4);
    lVar14 = lVar17 * 0x50;
    local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar14);
    local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar14) + 2);
    puVar1 = (uint *)(lVar15 + 0x10 + lVar14);
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar15 + 0x20 + lVar14);
    local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar15 + 0x30 + lVar14);
    local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_128.exp = *(int *)(lVar15 + 0x40 + lVar14);
    local_128.neg = *(bool *)(lVar15 + 0x44 + lVar14);
    local_128._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar14);
    if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_128,&local_a8), iVar12 < 0)) {
      lVar22 = local_b0;
    }
LAB_00479c3d:
    lVar17 = lVar17 * 0x50;
    local_1f8.data._M_elems._0_8_ = *(undefined8 *)(lVar22 + lVar17);
    local_1f8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar22 + lVar17) + 2);
    puVar1 = (uint *)(lVar22 + 0x10 + lVar17);
    local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar22 + 0x20 + lVar17);
    local_1f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar22 + 0x30 + lVar17);
    local_1f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_1f8.exp = *(int *)(lVar22 + 0x40 + lVar17);
    local_1f8.neg = *(bool *)(lVar22 + 0x44 + lVar17);
    local_1f8.fpclass = *(fpclass_type *)(lVar22 + 0x48 + lVar17);
    local_1f8.prec_elem = *(int32_t *)(lVar22 + 0x4c + lVar17);
    pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_c8 + lVar17);
    if (&local_198 == pcVar20) goto LAB_00479f0e;
    local_198.data._M_elems._56_5_ = local_1f8.data._M_elems._56_5_;
    local_198.data._M_elems[0xf]._1_3_ = local_1f8.data._M_elems[0xf]._1_3_;
    local_198.prec_elem = local_1f8.prec_elem;
    local_198.fpclass = local_1f8.fpclass;
    local_198.data._M_elems._0_8_ = local_1f8.data._M_elems._0_8_;
    local_198.data._M_elems._8_8_ = local_1f8.data._M_elems._8_8_;
    local_198.data._M_elems._16_8_ = local_1f8.data._M_elems._16_8_;
    local_198.data._M_elems._24_8_ = local_1f8.data._M_elems._24_8_;
    local_198.data._M_elems._32_8_ = local_1f8.data._M_elems._32_8_;
    local_198.data._M_elems._40_8_ = local_1f8.data._M_elems._40_8_;
    local_198.data._M_elems._48_8_ = local_1f8.data._M_elems._48_8_;
    local_198.exp = local_1f8.exp;
    local_198.neg = local_1f8.neg;
LAB_00479f07:
    local_1f8.data._M_elems._0_8_ = local_198.data._M_elems._0_8_;
    local_1f8.data._M_elems._8_8_ = local_198.data._M_elems._8_8_;
    local_1f8.data._M_elems._16_8_ = local_198.data._M_elems._16_8_;
    local_1f8.data._M_elems._24_8_ = local_198.data._M_elems._24_8_;
    local_1f8.data._M_elems._32_8_ = local_198.data._M_elems._32_8_;
    local_1f8.data._M_elems._40_8_ = local_198.data._M_elems._40_8_;
    local_1f8.data._M_elems._48_8_ = local_198.data._M_elems._48_8_;
    local_1f8.exp = local_198.exp;
    local_1f8.neg = local_198.neg;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_198,pcVar20);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&local_2b8,0,(type *)0x0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_1f8,&local_2b8);
    if (iVar12 < 1) goto LAB_004783ca;
    local_25c = 0xffffffff;
    local_2bc = 0xffffffff;
    if (0 < *(int *)(lVar14 + 0x70)) {
      local_48 = *(double *)(in_FS_OFFSET + -8);
      local_138 = &(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      uStack_40 = 0;
      local_58 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_2bc = 0xffffffff;
      lVar19 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar14 + 0x78) + lVar19 * 4);
        lVar21 = (long)iVar12 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar21);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar21) + 2);
        puVar1 = (uint *)(lVar17 + 0x10 + lVar21);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x20 + lVar21);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x30 + lVar21);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar17 + 0x40 + lVar21);
        local_128.neg = *(bool *)(lVar17 + 0x44 + lVar21);
        local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar21);
        if (((local_128.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_128,&local_a8), iVar13 < 1)) {
          uVar4._0_4_ = local_a8.data._M_elems[0];
          uVar4._4_4_ = local_a8.data._M_elems[1];
          local_2b8.data._M_elems[0] = local_a8.data._M_elems[0];
          local_2b8.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar5._0_4_ = local_a8.data._M_elems[2];
          uVar5._4_4_ = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[2] = local_a8.data._M_elems[2];
          local_2b8.data._M_elems[3] = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
          local_2b8.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
          local_2b8.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
          local_2b8.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
          local_2b8.data._M_elems[8] = local_a8.data._M_elems[8];
          local_2b8.data._M_elems[9] = local_a8.data._M_elems[9];
          local_2b8.data._M_elems[10] = local_a8.data._M_elems[10];
          local_2b8.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
          local_2b8.data._M_elems[4] = local_a8.data._M_elems[4];
          local_2b8.data._M_elems[5] = local_a8.data._M_elems[5];
          local_2b8.data._M_elems[6] = local_a8.data._M_elems[6];
          local_2b8.data._M_elems[7] = local_a8.data._M_elems[7];
          local_2b8.exp = local_a8.exp;
          local_2b8.neg = local_a8.neg;
          local_2b8.fpclass = local_a8.fpclass;
          local_2b8.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_2b8.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar3 = uVar4;
          uVar9 = uVar5;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
              local_128.fpclass != cpp_dec_float_NaN)) &&
             (local_2b8.data._M_elems._0_8_ = uVar4, local_2b8.data._M_elems._8_8_ = uVar5,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_128,&local_2b8), uVar3 = local_2b8.data._M_elems._0_8_,
             uVar9 = local_2b8.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_d0 + lVar21);
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_2b8,local_58);
            uVar3 = local_2b8.data._M_elems._0_8_;
            uVar9 = local_2b8.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(pcVar20,&local_2b8), uVar3 = local_2b8.data._M_elems._0_8_,
                     uVar9 = local_2b8.data._M_elems._8_8_, 0 < iVar13)) {
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 0x10;
              local_258.data._M_elems[0] = 0;
              local_258.data._M_elems[1] = 0;
              local_258.data._M_elems[2] = 0;
              local_258.data._M_elems[3] = 0;
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems[6] = 0;
              local_258.data._M_elems[7] = 0;
              local_258.data._M_elems[8] = 0;
              local_258.data._M_elems[9] = 0;
              local_258.data._M_elems[10] = 0;
              local_258.data._M_elems[0xb] = 0;
              local_258.data._M_elems[0xc] = 0;
              local_258.data._M_elems[0xd] = 0;
              local_258.data._M_elems._56_5_ = 0;
              local_258.data._M_elems[0xf]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,pcVar20);
                if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                  local_258.neg = (bool)(local_258.neg ^ 1);
                }
              }
              else {
                if (&local_258 != pcVar20) {
                  local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                  local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_258.exp = pcVar20->exp;
                  local_258.neg = pcVar20->neg;
                  local_258.fpclass = pcVar20->fpclass;
                  local_258.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
              }
              local_198.fpclass = cpp_dec_float_finite;
              local_198.prec_elem = 0x10;
              local_198.data._M_elems[0] = 0;
              local_198.data._M_elems[1] = 0;
              local_198.data._M_elems[2] = 0;
              local_198.data._M_elems[3] = 0;
              local_198.data._M_elems[4] = 0;
              local_198.data._M_elems[5] = 0;
              local_198.data._M_elems[6] = 0;
              local_198.data._M_elems[7] = 0;
              local_198.data._M_elems[8] = 0;
              local_198.data._M_elems[9] = 0;
              local_198.data._M_elems[10] = 0;
              local_198.data._M_elems[0xb] = 0;
              local_198.data._M_elems[0xc] = 0;
              local_198.data._M_elems[0xd] = 0;
              local_198.data._M_elems._56_5_ = 0;
              local_198.data._M_elems[0xf]._1_3_ = 0;
              local_198.exp = 0;
              local_198.neg = false;
              if (&local_198 == local_138) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_198,&local_258);
                if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                  local_198.neg = (bool)(local_198.neg ^ 1);
                }
              }
              else {
                local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
                local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
                local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
                local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
                local_198.data._M_elems[8] = local_258.data._M_elems[8];
                local_198.data._M_elems[9] = local_258.data._M_elems[9];
                local_198.data._M_elems[10] = local_258.data._M_elems[10];
                local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
                local_198.data._M_elems[4] = local_258.data._M_elems[4];
                local_198.data._M_elems[5] = local_258.data._M_elems[5];
                local_198.data._M_elems[6] = local_258.data._M_elems[6];
                local_198.data._M_elems[7] = local_258.data._M_elems[7];
                local_198.data._M_elems[0] = local_258.data._M_elems[0];
                local_198.data._M_elems[1] = local_258.data._M_elems[1];
                local_198.data._M_elems[2] = local_258.data._M_elems[2];
                local_198.data._M_elems[3] = local_258.data._M_elems[3];
                local_198.exp = local_258.exp;
                local_198.neg = local_258.neg;
                local_198.fpclass = local_258.fpclass;
                local_198.prec_elem = local_258.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_198,local_138);
              }
              goto LAB_004782d2;
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b8 + lVar21);
          local_2b8.fpclass = cpp_dec_float_finite;
          local_2b8.prec_elem = 0x10;
          local_2b8.data._M_elems[0] = 0;
          local_2b8.data._M_elems[1] = 0;
          local_2b8.data._M_elems[2] = 0;
          local_2b8.data._M_elems[3] = 0;
          local_2b8.data._M_elems[4] = 0;
          local_2b8.data._M_elems[5] = 0;
          local_2b8.data._M_elems[6] = 0;
          local_2b8.data._M_elems[7] = 0;
          local_2b8.data._M_elems[8] = 0;
          local_2b8.data._M_elems[9] = 0;
          local_2b8.data._M_elems[10] = 0;
          local_2b8.data._M_elems[0xb] = 0;
          local_2b8.data._M_elems[0xc] = 0;
          local_2b8.data._M_elems[0xd] = 0;
          local_2b8.data._M_elems._56_5_ = 0;
          local_2b8.data._M_elems[0xf]._1_3_ = 0;
          local_2b8.exp = 0;
          local_2b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_2b8,local_48);
          uVar3 = local_2b8.data._M_elems._0_8_;
          uVar9 = local_2b8.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_2b8), uVar3 = local_2b8.data._M_elems._0_8_,
                uVar9 = local_2b8.data._M_elems._8_8_, iVar13 < 0)) {
            local_258.fpclass = cpp_dec_float_finite;
            local_258.prec_elem = 0x10;
            local_258.data._M_elems[0] = 0;
            local_258.data._M_elems[1] = 0;
            local_258.data._M_elems[2] = 0;
            local_258.data._M_elems[3] = 0;
            local_258.data._M_elems[4] = 0;
            local_258.data._M_elems[5] = 0;
            local_258.data._M_elems[6] = 0;
            local_258.data._M_elems[7] = 0;
            local_258.data._M_elems[8] = 0;
            local_258.data._M_elems[9] = 0;
            local_258.data._M_elems[10] = 0;
            local_258.data._M_elems[0xb] = 0;
            local_258.data._M_elems[0xc] = 0;
            local_258.data._M_elems[0xd] = 0;
            local_258.data._M_elems._56_5_ = 0;
            local_258.data._M_elems[0xf]._1_3_ = 0;
            local_258.exp = 0;
            local_258.neg = false;
            if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,pcVar20);
              if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                local_258.neg = (bool)(local_258.neg ^ 1);
              }
            }
            else {
              if (&local_258 != pcVar20) {
                local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_258.exp = pcVar20->exp;
                local_258.neg = pcVar20->neg;
                local_258.fpclass = pcVar20->fpclass;
                local_258.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
            }
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            pcVar20 = &local_258;
            if (&local_198 != local_138) {
              local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_258.data._M_elems[8];
              local_198.data._M_elems[9] = local_258.data._M_elems[9];
              local_198.data._M_elems[10] = local_258.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_258.data._M_elems[4];
              local_198.data._M_elems[5] = local_258.data._M_elems[5];
              local_198.data._M_elems[6] = local_258.data._M_elems[6];
              local_198.data._M_elems[7] = local_258.data._M_elems[7];
              local_198.data._M_elems[0] = local_258.data._M_elems[0];
              local_198.data._M_elems[1] = local_258.data._M_elems[1];
              local_198.data._M_elems[2] = local_258.data._M_elems[2];
              local_198.data._M_elems[3] = local_258.data._M_elems[3];
              local_198.exp = local_258.exp;
              local_198.neg = local_258.neg;
              local_198.fpclass = local_258.fpclass;
              local_198.prec_elem = local_258.prec_elem;
              pcVar20 = local_138;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_198,pcVar20);
LAB_004782d2:
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_2b8,&local_198,&local_128);
            uVar3 = local_2b8.data._M_elems._0_8_;
            uVar9 = local_2b8.data._M_elems._8_8_;
            if (((local_2b8.fpclass != cpp_dec_float_NaN) &&
                (local_1f8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_2b8,&local_1f8), uVar3 = local_2b8.data._M_elems._0_8_,
               uVar9 = local_2b8.data._M_elems._8_8_, iVar13 < 0)) {
              iVar13 = (*(local_1a0->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_130 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_12,iVar13),iVar12);
              local_1f8.data._M_elems[4] = local_2b8.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_2b8.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_2b8.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_2b8.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_2b8.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_2b8.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_2b8.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf]._1_3_ = local_2b8.data._M_elems[0xf]._1_3_;
              local_1f8.data._M_elems._56_5_ = local_2b8.data._M_elems._56_5_;
              local_1f8.data._M_elems[0] = local_2b8.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_2b8.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_2b8.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_2b8.data._M_elems[3];
              local_1f8.exp = local_2b8.exp;
              local_1f8.neg = local_2b8.neg;
              local_1f8.fpclass = local_2b8.fpclass;
              local_1f8.prec_elem = local_2b8.prec_elem;
              local_2bc = (uint)lVar19;
              uVar3 = local_2b8.data._M_elems._0_8_;
              uVar9 = local_2b8.data._M_elems._8_8_;
            }
          }
        }
        local_2b8.data._M_elems._8_8_ = uVar9;
        local_2b8.data._M_elems._0_8_ = uVar3;
        lVar19 = lVar19 + 1;
      } while (lVar19 < *(int *)(lVar14 + 0x70));
    }
    lVar19 = local_200;
    if (0 < *(int *)(local_200 + 0x70)) {
      local_48 = *(double *)(in_FS_OFFSET + -8);
      local_138 = &(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      uStack_40 = 0;
      local_58 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_25c = 0xffffffff;
      lVar21 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar19 + 0x78) + lVar21 * 4);
        lVar22 = (long)iVar12 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar22);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar22) + 2);
        puVar1 = (uint *)(lVar15 + 0x10 + lVar22);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar15 + 0x20 + lVar22);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar15 + 0x30 + lVar22);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar15 + 0x40 + lVar22);
        local_128.neg = *(bool *)(lVar15 + 0x44 + lVar22);
        local_128._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar22);
        if (((local_128.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_128,&local_a8), iVar13 < 1)) {
          uVar6._0_4_ = local_a8.data._M_elems[0];
          uVar6._4_4_ = local_a8.data._M_elems[1];
          local_2b8.data._M_elems[0] = local_a8.data._M_elems[0];
          local_2b8.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar7._0_4_ = local_a8.data._M_elems[2];
          uVar7._4_4_ = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[2] = local_a8.data._M_elems[2];
          local_2b8.data._M_elems[3] = local_a8.data._M_elems[3];
          local_2b8.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
          local_2b8.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
          local_2b8.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
          local_2b8.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
          local_2b8.data._M_elems[8] = local_a8.data._M_elems[8];
          local_2b8.data._M_elems[9] = local_a8.data._M_elems[9];
          local_2b8.data._M_elems[10] = local_a8.data._M_elems[10];
          local_2b8.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
          local_2b8.data._M_elems[4] = local_a8.data._M_elems[4];
          local_2b8.data._M_elems[5] = local_a8.data._M_elems[5];
          local_2b8.data._M_elems[6] = local_a8.data._M_elems[6];
          local_2b8.data._M_elems[7] = local_a8.data._M_elems[7];
          local_2b8.exp = local_a8.exp;
          local_2b8.neg = local_a8.neg;
          local_2b8.fpclass = local_a8.fpclass;
          local_2b8.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_2b8.neg = (bool)(local_a8.neg ^ 1);
          }
          lVar19 = local_200;
          uVar3 = uVar6;
          uVar9 = uVar7;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
              local_128.fpclass != cpp_dec_float_NaN)) &&
             (local_2b8.data._M_elems._0_8_ = uVar6, local_2b8.data._M_elems._8_8_ = uVar7,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_128,&local_2b8), lVar19 = local_200,
             uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
             iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_c0 + lVar22);
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_2b8,local_58);
            lVar19 = local_200;
            uVar3 = local_2b8.data._M_elems._0_8_;
            uVar9 = local_2b8.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(pcVar20,&local_2b8), lVar19 = local_200,
                     uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
                     0 < iVar13)) {
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 0x10;
              local_258.data._M_elems[0] = 0;
              local_258.data._M_elems[1] = 0;
              local_258.data._M_elems[2] = 0;
              local_258.data._M_elems[3] = 0;
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems[6] = 0;
              local_258.data._M_elems[7] = 0;
              local_258.data._M_elems[8] = 0;
              local_258.data._M_elems[9] = 0;
              local_258.data._M_elems[10] = 0;
              local_258.data._M_elems[0xb] = 0;
              local_258.data._M_elems[0xc] = 0;
              local_258.data._M_elems[0xd] = 0;
              local_258.data._M_elems._56_5_ = 0;
              local_258.data._M_elems[0xf]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8)) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,pcVar20);
                if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                  local_258.neg = (bool)(local_258.neg ^ 1);
                }
              }
              else {
                if (&local_258 != pcVar20) {
                  local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                  local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_258.exp = pcVar20->exp;
                  local_258.neg = pcVar20->neg;
                  local_258.fpclass = pcVar20->fpclass;
                  local_258.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8));
              }
              lVar19 = local_200;
              local_198.fpclass = cpp_dec_float_finite;
              local_198.prec_elem = 0x10;
              local_198.data._M_elems[0] = 0;
              local_198.data._M_elems[1] = 0;
              local_198.data._M_elems[2] = 0;
              local_198.data._M_elems[3] = 0;
              local_198.data._M_elems[4] = 0;
              local_198.data._M_elems[5] = 0;
              local_198.data._M_elems[6] = 0;
              local_198.data._M_elems[7] = 0;
              local_198.data._M_elems[8] = 0;
              local_198.data._M_elems[9] = 0;
              local_198.data._M_elems[10] = 0;
              local_198.data._M_elems[0xb] = 0;
              local_198.data._M_elems[0xc] = 0;
              local_198.data._M_elems[0xd] = 0;
              local_198.data._M_elems._56_5_ = 0;
              local_198.data._M_elems[0xf]._1_3_ = 0;
              local_198.exp = 0;
              local_198.neg = false;
              if (&local_198 == local_138) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_198,&local_258);
                if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                  local_198.neg = (bool)(local_198.neg ^ 1);
                }
              }
              else {
                local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
                local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
                local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
                local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
                local_198.data._M_elems[8] = local_258.data._M_elems[8];
                local_198.data._M_elems[9] = local_258.data._M_elems[9];
                local_198.data._M_elems[10] = local_258.data._M_elems[10];
                local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
                local_198.data._M_elems[4] = local_258.data._M_elems[4];
                local_198.data._M_elems[5] = local_258.data._M_elems[5];
                local_198.data._M_elems[6] = local_258.data._M_elems[6];
                local_198.data._M_elems[7] = local_258.data._M_elems[7];
                local_198.data._M_elems[0] = local_258.data._M_elems[0];
                local_198.data._M_elems[1] = local_258.data._M_elems[1];
                local_198.data._M_elems[2] = local_258.data._M_elems[2];
                local_198.data._M_elems[3] = local_258.data._M_elems[3];
                local_198.exp = local_258.exp;
                local_198.neg = local_258.neg;
                local_198.fpclass = local_258.fpclass;
                local_198.prec_elem = local_258.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_198,local_138);
              }
              goto LAB_0047999b;
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b0 + lVar22);
          local_2b8.fpclass = cpp_dec_float_finite;
          local_2b8.prec_elem = 0x10;
          local_2b8.data._M_elems[0] = 0;
          local_2b8.data._M_elems[1] = 0;
          local_2b8.data._M_elems[2] = 0;
          local_2b8.data._M_elems[3] = 0;
          local_2b8.data._M_elems[4] = 0;
          local_2b8.data._M_elems[5] = 0;
          local_2b8.data._M_elems[6] = 0;
          local_2b8.data._M_elems[7] = 0;
          local_2b8.data._M_elems[8] = 0;
          local_2b8.data._M_elems[9] = 0;
          local_2b8.data._M_elems[10] = 0;
          local_2b8.data._M_elems[0xb] = 0;
          local_2b8.data._M_elems[0xc] = 0;
          local_2b8.data._M_elems[0xd] = 0;
          local_2b8.data._M_elems._56_5_ = 0;
          local_2b8.data._M_elems[0xf]._1_3_ = 0;
          local_2b8.exp = 0;
          local_2b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_2b8,local_48);
          lVar19 = local_200;
          uVar3 = local_2b8.data._M_elems._0_8_;
          uVar9 = local_2b8.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_2b8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_2b8), lVar19 = local_200,
                uVar3 = local_2b8.data._M_elems._0_8_, uVar9 = local_2b8.data._M_elems._8_8_,
                iVar13 < 0)) {
            local_258.fpclass = cpp_dec_float_finite;
            local_258.prec_elem = 0x10;
            local_258.data._M_elems[0] = 0;
            local_258.data._M_elems[1] = 0;
            local_258.data._M_elems[2] = 0;
            local_258.data._M_elems[3] = 0;
            local_258.data._M_elems[4] = 0;
            local_258.data._M_elems[5] = 0;
            local_258.data._M_elems[6] = 0;
            local_258.data._M_elems[7] = 0;
            local_258.data._M_elems[8] = 0;
            local_258.data._M_elems[9] = 0;
            local_258.data._M_elems[10] = 0;
            local_258.data._M_elems[0xb] = 0;
            local_258.data._M_elems[0xc] = 0;
            local_258.data._M_elems[0xd] = 0;
            local_258.data._M_elems._56_5_ = 0;
            local_258.data._M_elems[0xf]._1_3_ = 0;
            local_258.exp = 0;
            local_258.neg = false;
            if (&local_258 == (cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,pcVar20);
              if (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite) {
                local_258.neg = (bool)(local_258.neg ^ 1);
              }
            }
            else {
              if (&local_258 != pcVar20) {
                local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_258.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_258.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_258.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_258.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_258.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_258.exp = pcVar20->exp;
                local_258.neg = pcVar20->neg;
                local_258.fpclass = pcVar20->fpclass;
                local_258.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_258,(cpp_dec_float<100U,_int,_void> *)(lVar22 + local_c8));
            }
            lVar19 = local_200;
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            pcVar20 = &local_258;
            if (&local_198 != local_138) {
              local_198.data._M_elems[0xc] = local_258.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_258.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_258.data._M_elems[8];
              local_198.data._M_elems[9] = local_258.data._M_elems[9];
              local_198.data._M_elems[10] = local_258.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_258.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_258.data._M_elems[4];
              local_198.data._M_elems[5] = local_258.data._M_elems[5];
              local_198.data._M_elems[6] = local_258.data._M_elems[6];
              local_198.data._M_elems[7] = local_258.data._M_elems[7];
              local_198.data._M_elems[0] = local_258.data._M_elems[0];
              local_198.data._M_elems[1] = local_258.data._M_elems[1];
              local_198.data._M_elems[2] = local_258.data._M_elems[2];
              local_198.data._M_elems[3] = local_258.data._M_elems[3];
              local_198.exp = local_258.exp;
              local_198.neg = local_258.neg;
              local_198.fpclass = local_258.fpclass;
              local_198.prec_elem = local_258.prec_elem;
              pcVar20 = local_138;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_198,pcVar20);
LAB_0047999b:
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_2b8,&local_198,&local_128);
            uVar3 = local_2b8.data._M_elems._0_8_;
            uVar9 = local_2b8.data._M_elems._8_8_;
            if (((local_2b8.fpclass != cpp_dec_float_NaN) &&
                (local_1f8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_2b8,&local_1f8), uVar3 = local_2b8.data._M_elems._0_8_,
               uVar9 = local_2b8.data._M_elems._8_8_, iVar13 < 0)) {
              iVar13 = (*(local_1a0->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_130 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(extraout_var_15,iVar13),iVar12);
              local_1f8.data._M_elems[4] = local_2b8.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_2b8.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_2b8.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_2b8.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_2b8.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_2b8.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_2b8.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf]._1_3_ = local_2b8.data._M_elems[0xf]._1_3_;
              local_1f8.data._M_elems._56_5_ = local_2b8.data._M_elems._56_5_;
              local_1f8.data._M_elems[0] = local_2b8.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_2b8.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_2b8.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_2b8.data._M_elems[3];
              local_1f8.exp = local_2b8.exp;
              local_1f8.neg = local_2b8.neg;
              local_1f8.fpclass = local_2b8.fpclass;
              local_1f8.prec_elem = local_2b8.prec_elem;
              local_25c = (uint)lVar21;
              uVar3 = local_2b8.data._M_elems._0_8_;
              uVar9 = local_2b8.data._M_elems._8_8_;
            }
          }
        }
        local_2b8.data._M_elems._8_8_ = uVar9;
        local_2b8.data._M_elems._0_8_ = uVar3;
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)(lVar19 + 0x70));
    }
    lVar22 = local_c0;
    lVar21 = local_d8;
    max_00 = local_140;
    uVar18 = local_25c;
    if (-1 < (int)local_25c) {
      lVar17 = (long)*(int *)(*(long *)(lVar19 + 0x78) + (ulong)local_25c * 4);
      lVar14 = lVar17 * 0x50;
      local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar14);
      local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar14) + 2);
      puVar1 = (uint *)(lVar15 + 0x10 + lVar14);
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x20 + lVar14);
      local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x30 + lVar14);
      local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_128.exp = *(int *)(lVar15 + 0x40 + lVar14);
      local_128.neg = *(bool *)(lVar15 + 0x44 + lVar14);
      local_128._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar14);
      if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_128,&local_a8), 0 < iVar12)) {
        lVar22 = local_b0;
      }
      goto LAB_00479c3d;
    }
    if ((int)local_2bc < 0) goto LAB_00479fc9;
    lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x78) + (ulong)local_2bc * 4);
    lVar15 = lVar14 * 0x50;
    local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar15);
    local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar15) + 2);
    puVar1 = (uint *)(lVar17 + 0x10 + lVar15);
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar17 + 0x20 + lVar15);
    local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar17 + 0x30 + lVar15);
    local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_128.exp = *(int *)(lVar17 + 0x40 + lVar15);
    local_128.neg = *(bool *)(lVar17 + 0x44 + lVar15);
    local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar15);
    lVar17 = local_d0;
    if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_128,&local_a8), lVar17 = local_d0, 0 < iVar12)) {
      lVar17 = local_b8;
    }
LAB_00479e27:
    lVar14 = lVar14 * 0x50;
    local_1f8.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar14);
    local_1f8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar14) + 2);
    puVar1 = (uint *)(lVar17 + 0x10 + lVar14);
    local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar17 + 0x20 + lVar14);
    local_1f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar17 + 0x30 + lVar14);
    local_1f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_1f8.exp = *(int *)(lVar17 + 0x40 + lVar14);
    local_1f8.neg = *(bool *)(lVar17 + 0x44 + lVar14);
    local_1f8.fpclass = *(fpclass_type *)(lVar17 + 0x48 + lVar14);
    local_1f8.prec_elem = *(int32_t *)(lVar17 + 0x4c + lVar14);
    pcVar20 = (cpp_dec_float<100U,_int,_void> *)(lVar21 + lVar14);
    max_00 = local_140;
    if (&local_198 != pcVar20) {
      local_198.data._M_elems._56_5_ = local_1f8.data._M_elems._56_5_;
      local_198.data._M_elems[0xf]._1_3_ = local_1f8.data._M_elems[0xf]._1_3_;
      local_198.prec_elem = local_1f8.prec_elem;
      local_198.fpclass = local_1f8.fpclass;
      local_198.data._M_elems._0_8_ = local_1f8.data._M_elems._0_8_;
      local_198.data._M_elems._8_8_ = local_1f8.data._M_elems._8_8_;
      local_198.data._M_elems._16_8_ = local_1f8.data._M_elems._16_8_;
      local_198.data._M_elems._24_8_ = local_1f8.data._M_elems._24_8_;
      local_198.data._M_elems._32_8_ = local_1f8.data._M_elems._32_8_;
      local_198.data._M_elems._40_8_ = local_1f8.data._M_elems._40_8_;
      local_198.data._M_elems._48_8_ = local_1f8.data._M_elems._48_8_;
      local_198.exp = local_1f8.exp;
      local_198.neg = local_1f8.neg;
      goto LAB_00479f07;
    }
LAB_00479f0e:
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 0x10;
    local_198.neg = false;
    local_198.exp = 0;
    local_198.data._M_elems[0xf]._1_3_ = 0;
    local_198.data._M_elems._56_5_ = 0;
    local_198.data._M_elems[0xc] = 0;
    local_198.data._M_elems[0xd] = 0;
    local_198.data._M_elems[10] = 0;
    local_198.data._M_elems[0xb] = 0;
    local_198.data._M_elems[8] = 0;
    local_198.data._M_elems[9] = 0;
    local_198.data._M_elems[6] = 0;
    local_198.data._M_elems[7] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&local_198,&local_1f8);
    if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
      local_198.neg = (bool)(local_198.neg ^ 1);
    }
  }
  local_2b8.fpclass = cpp_dec_float_finite;
  local_2b8.prec_elem = 0x10;
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0;
  local_2b8.data._M_elems[2] = 0;
  local_2b8.data._M_elems[3] = 0;
  local_2b8.data._M_elems[4] = 0;
  local_2b8.data._M_elems[5] = 0;
  local_2b8.data._M_elems[6] = 0;
  local_2b8.data._M_elems[7] = 0;
  local_2b8.data._M_elems[8] = 0;
  local_2b8.data._M_elems[9] = 0;
  local_2b8.data._M_elems[10] = 0;
  local_2b8.data._M_elems[0xb] = 0;
  local_2b8.data._M_elems[0xc] = 0;
  local_2b8.data._M_elems[0xd] = 0;
  local_2b8.data._M_elems._56_5_ = 0;
  local_2b8.data._M_elems[0xf]._1_3_ = 0;
  local_2b8.exp = 0;
  local_2b8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2b8,&local_198,&local_128);
  local_1f8.data._M_elems[0xf]._1_3_ = local_2b8.data._M_elems[0xf]._1_3_;
  local_1f8.data._M_elems._56_5_ = local_2b8.data._M_elems._56_5_;
  local_1f8.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
  local_1f8.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
  local_1f8.data._M_elems[8] = local_2b8.data._M_elems[8];
  local_1f8.data._M_elems[9] = local_2b8.data._M_elems[9];
  local_1f8.data._M_elems[10] = local_2b8.data._M_elems[10];
  local_1f8.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
  local_1f8.data._M_elems[4] = local_2b8.data._M_elems[4];
  local_1f8.data._M_elems[5] = local_2b8.data._M_elems[5];
  local_1f8.data._M_elems[6] = local_2b8.data._M_elems[6];
  local_1f8.data._M_elems[7] = local_2b8.data._M_elems[7];
  local_1f8.data._M_elems[0] = local_2b8.data._M_elems[0];
  local_1f8.data._M_elems[1] = local_2b8.data._M_elems[1];
  local_1f8.data._M_elems[2] = local_2b8.data._M_elems[2];
  local_1f8.data._M_elems[3] = local_2b8.data._M_elems[3];
  local_1f8.exp = local_2b8.exp;
  local_1f8.neg = local_2b8.neg;
  local_1f8.fpclass = local_2b8.fpclass;
  local_1f8.prec_elem = local_2b8.prec_elem;
LAB_00479fc9:
  if (local_130.info != 0) {
    iVar12 = (*(local_1a0->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_16,iVar12),(SPxId *)&local_130);
    if (bVar11) {
      lVar17 = 0xc38;
      if ((-1 < (int)uVar18) || (lVar17 = 0xc40, uVar18 = local_2bc, -1 < (int)local_2bc)) {
        iVar12 = (*(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar17 = *(long *)(CONCAT44(extraout_var_17,iVar12) + lVar17);
        lVar14 = *(long *)(lVar17 + 0x78);
        lVar15 = *(long *)(lVar17 + 0x88);
        lVar19 = (long)*(int *)(lVar14 + (ulong)uVar18 * 4) * 0x50;
        *(undefined8 *)(lVar15 + 0x48 + lVar19) = 0x1000000000;
        *(undefined8 *)(lVar15 + lVar19) = 0;
        ((undefined8 *)(lVar15 + lVar19))[1] = 0;
        puVar2 = (undefined8 *)(lVar15 + 0x10 + lVar19);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)(lVar15 + 0x20 + lVar19);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)(lVar15 + 0x30 + lVar19);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)(lVar15 + 0x3d + lVar19) = 0;
        iVar12 = *(int *)(lVar17 + 0x70);
        *(int *)(lVar17 + 0x70) = iVar12 + -1;
        *(undefined4 *)(lVar14 + (ulong)uVar18 * 4) =
             *(undefined4 *)(lVar14 + -4 + (long)iVar12 * 4);
      }
      DVar16 = (DataKey)selectEnter(local_1a0,max_00,0,false);
      return (SPxId)DVar16;
    }
  }
  *(undefined8 *)((max_00->m_backend).data._M_elems + 0xc) = local_1f8.data._M_elems._48_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 0xe) = local_1f8.data._M_elems._56_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 8) = local_1f8.data._M_elems._32_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 10) = local_1f8.data._M_elems._40_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 4) = local_1f8.data._M_elems._16_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 6) = local_1f8.data._M_elems._24_8_;
  *(undefined8 *)(max_00->m_backend).data._M_elems = local_1f8.data._M_elems._0_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 2) = local_1f8.data._M_elems._8_8_;
  (max_00->m_backend).exp = local_1f8.exp;
  (max_00->m_backend).neg = local_1f8.neg;
  (max_00->m_backend).fpclass = local_1f8.fpclass;
  (max_00->m_backend).prec_elem = local_1f8.prec_elem;
  return (SPxId)local_130;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}